

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.hpp
# Opt level: O2

uint64_t __thiscall webfront::websocket::Header::extendedLenField(Header *this)

{
  byte bVar1;
  byte bVar2;
  
  bVar1 = (this->raw)._M_elems[2];
  bVar2 = (this->raw)._M_elems[3];
  if (((this->raw)._M_elems[1] & 0x7f) == 0x7e) {
    return (ulong)CONCAT11(bVar1,bVar2);
  }
  return (ulong)(this->raw)._M_elems[9] |
         (ulong)(this->raw)._M_elems[8] << 8 |
         (ulong)(this->raw)._M_elems[7] << 0x10 |
         (ulong)(this->raw)._M_elems[6] << 0x18 |
         (ulong)(this->raw)._M_elems[5] << 0x20 |
         (ulong)(this->raw)._M_elems[4] << 0x28 | (ulong)bVar2 << 0x30 | (ulong)bVar1 << 0x38;
}

Assistant:

[[nodiscard]] uint64_t extendedLenField() const {
        auto s = [this](size_t i, uint8_t shift = 0) constexpr { return std::to_integer<uint64_t>(raw[i]) << shift; };
        return payloadLenField() == 126 ? s(2, 8) | s(3) : s(2, 56) | s(3, 48) | s(4, 40) | s(5, 32) | s(6, 24) | s(7, 16) | s(8, 8) | s(9, 0);
    }